

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

int __thiscall
kj::ArrayBuilder<kj::StringTree>::truncate
          (ArrayBuilder<kj::StringTree> *this,char *__file,__off_t __length)

{
  StringTree *pSVar1;
  StringTree *pSVar2;
  Branch *pBVar3;
  size_t sVar4;
  ArrayDisposer *pAVar5;
  char *pcVar6;
  int in_EAX;
  StringTree *pSVar7;
  
  pSVar1 = this->ptr;
  pSVar2 = this->pos;
  while (pSVar1 + (long)__file < pSVar2) {
    pSVar7 = pSVar2 + -1;
    this->pos = pSVar7;
    pBVar3 = pSVar2[-1].branches.ptr;
    if (pBVar3 != (Branch *)0x0) {
      sVar4 = pSVar2[-1].branches.size_;
      pSVar2[-1].branches.ptr = (Branch *)0x0;
      pSVar2[-1].branches.size_ = 0;
      pAVar5 = pSVar2[-1].branches.disposer;
      pSVar7 = (StringTree *)
               (*(code *)**(undefined8 **)pAVar5)
                         (pAVar5,pBVar3,0x40,sVar4,sVar4,
                          ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    }
    in_EAX = (int)pSVar7;
    pcVar6 = pSVar2[-1].text.content.ptr;
    if (pcVar6 != (char *)0x0) {
      sVar4 = pSVar2[-1].text.content.size_;
      pSVar2[-1].text.content.ptr = (char *)0x0;
      pSVar2[-1].text.content.size_ = 0;
      pAVar5 = pSVar2[-1].text.content.disposer;
      in_EAX = (*(code *)**(undefined8 **)pAVar5)(pAVar5,pcVar6,1,sVar4,sVar4,0);
    }
    pSVar2 = this->pos;
  }
  return in_EAX;
}

Assistant:

void truncate(size_t size) {
    KJ_IREQUIRE(size <= this->size(), "can't use truncate() to expand");

    T* target = ptr + size;
    if (__has_trivial_destructor(T)) {
      pos = target;
    } else {
      while (pos > target) {
        kj::dtor(*--pos);
      }
    }
  }